

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

size_t llama_state_seq_save_file
                 (llama_context *ctx,char *filepath,llama_seq_id seq_id,llama_token *tokens,
                 size_t n_token_count)

{
  size_t sVar1;
  
  llama_context::synchronize(ctx);
  sVar1 = llama_context::state_seq_save_file(ctx,seq_id,filepath,tokens,n_token_count);
  return sVar1;
}

Assistant:

size_t llama_state_seq_save_file(llama_context * ctx, const char * filepath, llama_seq_id seq_id, const llama_token * tokens, size_t n_token_count) {
    ctx->synchronize();

    try {
        return ctx->state_seq_save_file(seq_id, filepath, tokens, n_token_count);
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: error saving sequence state file: %s\n", __func__, err.what());
        return 0;
    }
}